

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabUnlock(VTable *pVTab)

{
  undefined8 *in_RDI;
  sqlite3_vtab *p;
  sqlite3 *db;
  Module *pMod;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)*in_RDI;
  *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + -1;
  if (*(int *)(in_RDI + 3) == 0) {
    pMod = (Module *)in_RDI[2];
    if (pMod != (Module *)0x0) {
      (*pMod->pModule->xDisconnect)((sqlite3_vtab *)pMod);
    }
    sqlite3VtabModuleUnref(db_00,pMod);
    sqlite3DbFree(db_00,pMod);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabUnlock(VTable *pVTab){
  sqlite3 *db = pVTab->db;

  assert( db );
  assert( pVTab->nRef>0 );
  assert( db->eOpenState==SQLITE_STATE_OPEN
       || db->eOpenState==SQLITE_STATE_ZOMBIE );

  pVTab->nRef--;
  if( pVTab->nRef==0 ){
    sqlite3_vtab *p = pVTab->pVtab;
    if( p ){
      p->pModule->xDisconnect(p);
    }
    sqlite3VtabModuleUnref(pVTab->db, pVTab->pMod);
    sqlite3DbFree(db, pVTab);
  }
}